

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall metaf::TrendGroup::isTimeSpanGroup(TrendGroup *this)

{
  bool bVar1;
  Type TVar2;
  Probability PVar3;
  TrendGroup *in_RDI;
  byte local_4d;
  optional<metaf::MetafTime> local_4c;
  optional<metaf::MetafTime> local_38;
  optional<metaf::MetafTime> local_24;
  bool local_1;
  
  TVar2 = type(in_RDI);
  local_4d = 1;
  if ((TVar2 == TIME_SPAN) && (local_4d = 1, (in_RDI->isTafTimeSpanGroup & 1U) != 0)) {
    PVar3 = probability(in_RDI);
    local_4d = 1;
    if (PVar3 == NONE) {
      timeFrom(&local_24,in_RDI);
      bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x240ee2);
      local_4d = 1;
      if (bVar1) {
        timeUntil(&local_38,in_RDI);
        bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x240f09);
        local_4d = bVar1 ^ 0xff;
      }
    }
  }
  if ((local_4d & 1) == 0) {
    timeAt(&local_4c,in_RDI);
    bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x240f38);
    if (bVar1) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TrendGroup::isTimeSpanGroup() const {
	// Time span group has format DDHH/DDHH,
	// only time 'from' and 'till' must be reported
	// isTafTimeSpanGroup guarantees that DDHH/DDHH group is 
	// not confused with appended groups FMxxxx TLxxxx and HHMM/HHMM
	if (type() != Type::TIME_SPAN ||
		!isTafTimeSpanGroup ||
		probability() != Probability::NONE ||
		!timeFrom().has_value() || 
		!timeUntil().has_value()) return false;
	if (timeAt().has_value()) return false;
	return true;
}